

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratiotest.cpp
# Opt level: O1

RatiotestResult
ratiotest_textbook(Runtime *rt,QpVector *p,QpVector *rowmove,Instance *instance,double alphastart)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  uint uVar8;
  HighsInt *pHVar9;
  uint uVar10;
  QpVector *pQVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  RatiotestResult RVar15;
  
  pHVar9 = &p->num_nz;
  if ((long)*pHVar9 < 1) {
    uVar10 = 0xffffffff;
  }
  else {
    pvVar1 = &p->index;
    pvVar2 = &p->value;
    dVar3 = (rt->settings).ratiotest_t;
    uVar10 = 0xffffffff;
    lVar12 = 0;
    dVar14 = alphastart;
    do {
      iVar7 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar12];
      dVar4 = (rt->primal).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar7];
      dVar13 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[iVar7];
      dVar5 = (instance->var_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar7];
      dVar6 = (instance->var_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar7];
      if ((dVar5 == -INFINITY) || (-dVar3 <= dVar13)) {
        alphastart = INFINITY;
        if ((dVar6 != INFINITY) && (alphastart = INFINITY, dVar3 < dVar13)) {
          alphastart = (dVar6 - dVar4) / dVar13;
        }
      }
      else {
        alphastart = (dVar5 - dVar4) / dVar13;
      }
      if (alphastart < dVar14) {
        uVar10 = iVar7 + instance->num_con;
      }
      pQVar11 = (QpVector *)((ulong)p & 0xff);
      p = (QpVector *)(ulong)(dVar13 < 0.0);
      if (dVar14 <= alphastart) {
        alphastart = dVar14;
        p = pQVar11;
      }
      lVar12 = lVar12 + 1;
      dVar14 = alphastart;
    } while (*pHVar9 != lVar12);
  }
  if (0 < (long)rowmove->num_nz) {
    dVar3 = (rt->settings).ratiotest_t;
    lVar12 = 0;
    do {
      uVar8 = (rowmove->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12];
      dVar14 = (rt->rowactivity).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[(int)uVar8];
      dVar4 = (rowmove->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[(int)uVar8];
      dVar13 = (instance->con_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[(int)uVar8];
      dVar5 = (instance->con_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[(int)uVar8];
      if ((dVar13 == -INFINITY) || (-dVar3 <= dVar4)) {
        dVar13 = INFINITY;
        if ((dVar5 != INFINITY) && (dVar13 = INFINITY, dVar3 < dVar4)) {
          dVar13 = (dVar5 - dVar14) / dVar4;
        }
      }
      else {
        dVar13 = (dVar13 - dVar14) / dVar4;
      }
      if (dVar13 < alphastart) {
        uVar10 = uVar8;
      }
      p = (QpVector *)((ulong)p & 0xff);
      if (dVar13 < alphastart) {
        p = (QpVector *)(ulong)(dVar4 < 0.0);
        alphastart = dVar13;
      }
      lVar12 = lVar12 + 1;
    } while (rowmove->num_nz != lVar12);
  }
  RVar15._8_8_ = (ulong)uVar10 | ((ulong)p & 0xff) << 0x20;
  RVar15.alpha = alphastart;
  return RVar15;
}

Assistant:

static RatiotestResult ratiotest_textbook(Runtime& rt, const QpVector& p,
                                          const QpVector& rowmove,
                                          Instance& instance,
                                          const double alphastart) {
  RatiotestResult result;
  result.limitingconstraint = -1;
  result.alpha = alphastart;

  // check ratio towards variable bounds
  for (HighsInt j = 0; j < p.num_nz; j++) {
    HighsInt i = p.index[j];
    double alpha_i = step(rt.primal.value[i], p.value[i], instance.var_lo[i],
                          instance.var_up[i], rt.settings.ratiotest_t);
    if (alpha_i < result.alpha) {
      result.alpha = alpha_i;
      result.limitingconstraint = instance.num_con + i;
      result.nowactiveatlower = p.value[i] < 0;
    }
  }

  // check ratio towards constraint bounds
  for (HighsInt j = 0; j < rowmove.num_nz; j++) {
    HighsInt i = rowmove.index[j];
    double alpha_i =
        step(rt.rowactivity.value[i], rowmove.value[i], instance.con_lo[i],
             instance.con_up[i], rt.settings.ratiotest_t);
    if (alpha_i < result.alpha) {
      result.alpha = alpha_i;
      result.limitingconstraint = i;
      result.nowactiveatlower = rowmove.value[i] < 0;
    }
  }

  return result;
}